

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::HttpServer::SuspendedRequest>::Maybe
          (Maybe<kj::HttpServer::SuspendedRequest> *this,
          Maybe<kj::HttpServer::SuspendedRequest> *other)

{
  NullableValue<kj::HttpServer::SuspendedRequest> *other_00;
  Maybe<kj::HttpServer::SuspendedRequest> *other_local;
  Maybe<kj::HttpServer::SuspendedRequest> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::HttpServer::SuspendedRequest>>(&other->ptr);
  kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }